

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

Path * __thiscall kj::Path::parent(Path *__return_storage_ptr__,Path *this)

{
  String *pSVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  char *pcVar4;
  String *pSVar5;
  String *pSVar6;
  String *pSVar7;
  Fault f;
  DebugComparison<unsigned_long,_int> _kjCondition;
  
  sVar2 = (this->parts).size_;
  _kjCondition.right = 0;
  _kjCondition.op.content.ptr = " > ";
  _kjCondition.op.content.size_ = 4;
  _kjCondition.result = sVar2 != 0;
  _kjCondition.left = sVar2;
  if (_kjCondition.result) {
    pSVar7 = (this->parts).ptr;
    pSVar5 = (String *)
             kj::_::HeapArrayDisposer::allocateImpl
                       (0x18,0,sVar2 - 1,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    pSVar6 = pSVar5;
    if (sVar2 - 1 != 0) {
      pSVar1 = pSVar7 + (sVar2 - 1);
      do {
        pcVar4 = (pSVar7->content).ptr;
        sVar2 = (pSVar7->content).size_;
        pAVar3 = (pSVar7->content).disposer;
        (pSVar7->content).ptr = (char *)0x0;
        (pSVar7->content).size_ = 0;
        (pSVar6->content).ptr = pcVar4;
        (pSVar6->content).size_ = sVar2;
        (pSVar6->content).disposer = pAVar3;
        pSVar6 = pSVar6 + 1;
        pSVar7 = pSVar7 + 1;
      } while (pSVar7 != pSVar1);
    }
    (__return_storage_ptr__->parts).ptr = pSVar5;
    (__return_storage_ptr__->parts).size_ = ((long)pSVar6 - (long)pSVar5 >> 3) * -0x5555555555555555
    ;
    (__return_storage_ptr__->parts).disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[24]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
             ,0x83,FAILED,"parts.size() > 0","_kjCondition,\"root path has no parent\"",
             &_kjCondition,(char (*) [24])"root path has no parent");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

bool PathPtr::operator==(PathPtr other) const {
  return parts == other.parts;
}